

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O1

bool __thiscall
rsg::anon_unknown_0::IsReadableIntersectingEntry::operator()
          (IsReadableIntersectingEntry *this,ValueEntry *entry)

{
  bool bVar1;
  ConstValueRangeAccess local_30;
  
  if ((((this->super_IsReadableEntry).m_exprFlags & 1) == 0) ||
     (entry->m_variable->m_storage == STORAGE_CONST)) {
    bVar1 = VariableType::operator!=(&(entry->m_valueRange).m_type,(this->m_valueRange).m_type);
    if (!bVar1) {
      local_30.m_min =
           (entry->m_valueRange).m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_30.m_max =
           (entry->m_valueRange).m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>
           ._M_impl.super__Vector_impl_data._M_start;
      if (local_30.m_min ==
          (entry->m_valueRange).m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        local_30.m_min = (pointer)0x0;
      }
      if (local_30.m_max ==
          (entry->m_valueRange).m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        local_30.m_max = (pointer)0x0;
      }
      local_30.m_type = &(entry->m_valueRange).m_type;
      bVar1 = ConstValueRangeAccess::intersects(&local_30,&this->m_valueRange);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool operator() (const ValueEntry* entry) const
	{
		if (!IsReadableEntry::operator()(entry))
			return false;

		if (entry->getValueRange().getType() != m_valueRange.getType())
			return false;

		if (!entry->getValueRange().intersects(m_valueRange))
			return false;

		return true;
	}